

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

bool __thiscall Loop::RemoveBreakBlocks(Loop *this,FlowGraph *fg)

{
  undefined1 *puVar1;
  Loop *pLVar2;
  code *pcVar3;
  bool bVar4;
  uint sourceContextId;
  uint functionId;
  BasicBlock *block;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  undefined4 *puVar5;
  Type *ppBVar6;
  BasicBlock *pBVar7;
  BasicBlock *pBVar8;
  Type pBVar9;
  Type blockEnd;
  BasicBlock *blockStart;
  Loop *pLVar10;
  Type pBVar11;
  Type pBVar12;
  bool bVar13;
  undefined1 local_40 [8];
  Iterator __iter;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(fg->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(fg->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar4 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bbe90,RemoveBreakBlockPhase,sourceContextId,functionId);
  if (!bVar4) {
    local_40 = (undefined1  [8])&this->blockList;
    __iter.list = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)local_40;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    pBVar12 = (Type)0x0;
    while( true ) {
      if (__iter.list == (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) goto LAB_0041b1ec;
        *puVar5 = 0;
      }
      __iter.list = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                    ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      if ((undefined1  [8])__iter.list == local_40) break;
      ppBVar6 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)local_40);
      if (((*ppBVar6)->field_0x18 & 1) == 0) {
        pBVar12 = *ppBVar6;
      }
    }
    __iter.list = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
    if (pBVar12 == (Type)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x412,"(loopTailBlock)","loopTailBlock");
      if (!bVar4) {
LAB_0041b1ec:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    pBVar7 = GetHeadBlock(this);
    if (pBVar7 == (BasicBlock *)0x0) {
      pBVar11 = (Type)0x0;
    }
    else {
      pBVar7 = GetHeadBlock(this);
      pBVar11 = pBVar7->prev;
    }
    if (pBVar12 != pBVar11) {
      bVar4 = false;
      pBVar9 = pBVar12;
      while (pBVar7 = pBVar9->prev, puVar1 = &pBVar9->field_0x18, blockEnd = pBVar9, pBVar9 = pBVar7
            , (*puVar1 & 1) != 0) {
LAB_0041b1cb:
        if (pBVar9 == pBVar11) {
          return bVar4;
        }
      }
LAB_0041b0fe:
      pLVar2 = blockEnd->loop;
      bVar13 = pLVar2 != (Loop *)0x0;
      pLVar10 = pLVar2;
      if (pLVar2 != this && bVar13) {
        do {
          pLVar10 = pLVar10->parent;
          bVar13 = pLVar10 != (Loop *)0x0;
          if (pLVar10 == this) break;
        } while (pLVar10 != (Loop *)0x0);
      }
      pBVar9 = pBVar7;
      if (!bVar13) {
        blockEnd->field_0x19 = blockEnd->field_0x19 | 1;
        pBVar7 = blockEnd;
        do {
          pBVar7 = pBVar7->prev;
          blockStart = blockEnd;
        } while ((pBVar7->field_0x18 & 1) != 0);
        do {
          pBVar8 = pBVar7;
          pLVar10 = pBVar8->loop;
          pBVar7 = pBVar8;
          if (pLVar10 != pLVar2) {
            bVar4 = pLVar10 != (Loop *)0x0;
            if (pLVar10 != this && bVar4) {
              do {
                pLVar10 = pLVar10->parent;
                bVar4 = pLVar10 != (Loop *)0x0;
                if (pLVar10 == this) break;
              } while (pLVar10 != (Loop *)0x0);
            }
            if (bVar4) goto LAB_0041b19d;
          }
          do {
            pBVar7 = pBVar7->prev;
            blockStart = pBVar8;
          } while ((pBVar7->field_0x18 & 1) != 0);
        } while( true );
      }
      goto LAB_0041b1cb;
    }
  }
  return false;
LAB_0041b19d:
  blockStart->field_0x19 = blockStart->field_0x19 | 1;
  FlowGraph::MoveBlocksBefore(fg,blockStart,blockEnd,pBVar12->next);
  FlowGraph::Dump(fg,true,L"\n After Each iteration of canonicalization \n");
  pBVar7 = pBVar12->prev;
  bVar4 = true;
  blockEnd = pBVar12;
  goto LAB_0041b0fe;
}

Assistant:

bool
Loop::RemoveBreakBlocks(FlowGraph *fg)
{
    bool breakBlockRelocated = false;
    if (PHASE_OFF(Js::RemoveBreakBlockPhase, fg->GetFunc()))
    {
        return false;
    }

    BasicBlock *loopTailBlock = nullptr;
    FOREACH_BLOCK_IN_LOOP(block, this)
    {
        loopTailBlock = block;
    }NEXT_BLOCK_IN_LOOP;

    AnalysisAssert(loopTailBlock);

    FOREACH_BLOCK_BACKWARD_IN_RANGE_EDITING(breakBlockEnd, loopTailBlock, this->GetHeadBlock(), blockPrev)
    {
        while (!this->IsDescendentOrSelf(breakBlockEnd->loop))
        {
            // Found at least one break block;
            breakBlockRelocated = true;

#if DBG
            breakBlockEnd->isBreakBlock = true;
#endif
            // Find the first block in this break block sequence.
            BasicBlock *breakBlockStart = breakBlockEnd;
            BasicBlock *breakBlockStartPrev = breakBlockEnd->GetPrev();

            // Walk back the blocks until we find a block which belongs to that block.
            // Note: We don't really care if there are break blocks corresponding to different loops. We move the blocks conservatively to the end of the loop.

            // Algorithm works on one loop at a time.
            while((breakBlockStartPrev->loop == breakBlockEnd->loop) || !this->IsDescendentOrSelf(breakBlockStartPrev->loop))
            {
                breakBlockStart = breakBlockStartPrev;
                breakBlockStartPrev = breakBlockStartPrev->GetPrev();
            }

#if DBG
            breakBlockStart->isBreakBlock = true; // Mark the first block as well.
#endif

            BasicBlock *exitLoopTail = loopTailBlock;
            // Move these break blocks to the tail of the loop.
            fg->MoveBlocksBefore(breakBlockStart, breakBlockEnd, exitLoopTail->next);

#if DBG_DUMP
            fg->Dump(true /*needs verbose flag*/, _u("\n After Each iteration of canonicalization \n"));
#endif
            // Again be conservative, there are edits to the loop graph. Start fresh for this loop.
            breakBlockEnd = loopTailBlock;
            blockPrev = breakBlockEnd->prev;
        }
    } NEXT_BLOCK_BACKWARD_IN_RANGE_EDITING;

    return breakBlockRelocated;
}